

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O0

undefined8 hashBlockToHex_abi_cxx11_(HashBlock block)

{
  bool __x;
  ostream *this;
  unsigned_long uVar1;
  undefined8 in_RDI;
  reference local_1d8 [2];
  undefined1 local_1b8 [24];
  int j;
  int i;
  stringstream stream;
  ostream local_190 [376];
  bitset<8UL> local_18;
  ByteBitSet c;
  
  std::bitset<8UL>::bitset(&local_18);
  std::__cxx11::stringstream::stringstream((stringstream *)&j);
  for (local_1b8._20_4_ = 0; (int)local_1b8._20_4_ < 0x40; local_1b8._20_4_ = local_1b8._20_4_ + 1)
  {
    for (local_1b8._16_4_ = 0; (int)local_1b8._16_4_ < 4; local_1b8._16_4_ = local_1b8._16_4_ + 1) {
      std::bitset<256UL>::operator[]((bitset<256UL> *)local_1b8,(size_t)&stack0x00000008);
      __x = std::bitset::reference::operator_cast_to_bool((reference *)local_1b8);
      std::bitset<8UL>::operator[]((bitset<8UL> *)local_1d8,(size_t)&local_18);
      std::bitset<8UL>::reference::operator=(local_1d8,__x);
      std::bitset<8UL>::reference::~reference(local_1d8);
      std::bitset<256UL>::reference::~reference((reference *)local_1b8);
    }
    this = (ostream *)std::ostream::operator<<(local_190,std::hex);
    uVar1 = std::bitset<8UL>::to_ulong(&local_18);
    std::ostream::operator<<(this,uVar1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&j);
  return in_RDI;
}

Assistant:

std::string hashBlockToHex(HashBlock block) {
    ByteBitSet c;
    std::stringstream stream;

    for (int i = 0; i < HASH_OUTPUT_SEGMENT_SIZE * 2; i++) {
        for (int j = 0; j < CHAR_SIZE_BIT / 2; j++) {
            c[(CHAR_SIZE_BIT / 2) - 1 - j] = block[HASH_OUTPUT_SIZE - 1 - (i * CHAR_SIZE_BIT / 2) - j];
        }

        stream << std::hex << c.to_ulong();

    }


    return stream.str();
}